

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

void string_append(CHAR_DATA *ch,char **pString)

{
  char *pcVar1;
  size_t sVar2;
  char **in_RSI;
  CHAR_DATA *in_RDI;
  char *unaff_retaddr;
  char *in_stack_00000018;
  
  send_to_char(unaff_retaddr,in_RDI);
  send_to_char(unaff_retaddr,in_RDI);
  send_to_char(unaff_retaddr,in_RDI);
  send_to_char(unaff_retaddr,in_RDI);
  if (*in_RSI == (char *)0x0) {
    pcVar1 = palloc_string(in_stack_00000018);
    *in_RSI = pcVar1;
  }
  send_to_char(unaff_retaddr,in_RDI);
  pcVar1 = *in_RSI;
  sVar2 = strlen(*in_RSI);
  if (pcVar1[sVar2 - 1] != '\r') {
    send_to_char(unaff_retaddr,in_RDI);
  }
  in_RDI->desc->pString = in_RSI;
  return;
}

Assistant:

void string_append(CHAR_DATA *ch, char **pString)
{
	send_to_char("-=======- Entering APPEND Mode -========-\n\r", ch);
	send_to_char("    Type .h on a new line for help\n\r", ch);
	send_to_char(" Terminate with a ~ or @ on a blank line.\n\r", ch);
	send_to_char("-=======================================-\n\r", ch);

	if (*pString == nullptr)
		*pString = palloc_string("");

	send_to_char(*pString, ch);

	if (*(*pString + strlen(*pString) - 1) != '\r')
		send_to_char("\n\r", ch);

	ch->desc->pString = pString;
}